

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrthogonalPackingSolver2D.h
# Opt level: O0

void __thiscall
tsbp::OrthogonalPackingSolver2D::OrthogonalPackingSolver2D
          (OrthogonalPackingSolver2D *this,
          vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_> *items,Bin *container,
          InputParameters *inputParameters)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  InputParameters *inputParameters_local;
  Bin *container_local;
  vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_> *items_local;
  OrthogonalPackingSolver2D *this_local;
  
  CLI::std::vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>::vector(&this->items,items);
  iVar3 = (container->super_Rectangle).X;
  iVar4 = (container->super_Rectangle).Y;
  iVar5 = (container->super_Rectangle).Dx;
  iVar6 = (container->super_Rectangle).Dy;
  iVar2 = (container->super_Rectangle).ExternId;
  dVar1 = (container->super_Rectangle).Area;
  (this->container).super_Rectangle.InternId = (container->super_Rectangle).InternId;
  (this->container).super_Rectangle.ExternId = iVar2;
  (this->container).super_Rectangle.Area = dVar1;
  (this->container).super_Rectangle.X = iVar3;
  (this->container).super_Rectangle.Y = iVar4;
  (this->container).super_Rectangle.Dx = iVar5;
  (this->container).super_Rectangle.Dy = iVar6;
  InputParameters::InputParameters(&this->inputParameters,inputParameters);
  SolverStatistics::SolverStatistics(&this->solutionStatistics);
  Packing2D::Packing2D(&this->solution);
  std::unique_ptr<tsbp::IBranchAndBoundSolver,std::default_delete<tsbp::IBranchAndBoundSolver>>::
  unique_ptr<std::default_delete<tsbp::IBranchAndBoundSolver>,void>
            ((unique_ptr<tsbp::IBranchAndBoundSolver,std::default_delete<tsbp::IBranchAndBoundSolver>>
              *)&this->branchAndBoundSearch);
  return;
}

Assistant:

OrthogonalPackingSolver2D(const std::vector<Rectangle>& items, const Bin& container, const InputParameters& inputParameters)
        :
        items(items),
        container(container),
        inputParameters(inputParameters) {}